

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall
ShaderProgram::ShaderProgram(ShaderProgram *this,string_view *vs_path,string_view *fs_path)

{
  GLuint GVar1;
  size_t sVar2;
  char local_228 [8];
  char infoLog [512];
  int flag;
  
  GVar1 = CompileAndLogShader(vs_path,0x8b31);
  this->vertex_shader = GVar1;
  GVar1 = CompileAndLogShader(fs_path,0x8b30);
  this->fragment_shader = GVar1;
  GVar1 = (*glad_glCreateProgram)();
  this->shader_program = GVar1;
  (*glad_glAttachShader)(GVar1,this->vertex_shader);
  (*glad_glAttachShader)(this->shader_program,this->fragment_shader);
  (*glad_glLinkProgram)(this->shader_program);
  (*glad_glGetProgramiv)(this->shader_program,0x8b82,(GLint *)(infoLog + 0x1fc));
  if (infoLog._508_4_ == 0) {
    (*glad_glGetProgramInfoLog)(this->shader_program,0x200,(GLsizei *)0x0,local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to link shader program .. ",0x21);
    sVar2 = strlen(local_228);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_228,sVar2);
  }
  (*glad_glDeleteShader)(this->vertex_shader);
  (*glad_glDeleteShader)(this->fragment_shader);
  return;
}

Assistant:

ShaderProgram::ShaderProgram(const std::string_view &vs_path,
                             const std::string_view &fs_path)
{
    // this procedure compiles both fragment and vertex shader
    vertex_shader = CompileAndLogShader(vs_path, GL_VERTEX_SHADER);
    fragment_shader = CompileAndLogShader(fs_path, GL_FRAGMENT_SHADER);

    shader_program = glCreateProgram();
    glAttachShader(shader_program, vertex_shader);
    glAttachShader(shader_program, fragment_shader);
    glLinkProgram(shader_program);
    

    int flag;
    glGetProgramiv(shader_program,GL_LINK_STATUS, &flag);
    if (!flag)
    {
	char infoLog[512];
	glGetProgramInfoLog(shader_program,512,NULL,infoLog);
	std::cerr << "Failed to link shader program .. " << infoLog;
    }
    glDeleteShader(vertex_shader);
    glDeleteShader(fragment_shader);
}